

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O2

void __thiscall Fl_Widget::draw_focus(Fl_Widget *this)

{
  draw_focus(this,(uint)this->box_,this->x_,this->y_,this->w_,this->h_);
  return;
}

Assistant:

Fl_Boxtype box() const {return (Fl_Boxtype)box_;}